

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring.cpp
# Opt level: O2

void duckdb::SetBitOperation(DataChunk *args,ExpressionState *state,Vector *result)

{
  UnifiedVectorFormat *pUVar1;
  long lVar2;
  anon_union_16_2_67f50693_for_value *paVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  UnifiedVectorFormat *pUVar7;
  UnifiedVectorFormat *pUVar8;
  UnifiedVectorFormat *pUVar9;
  ValidityMask *in_R9;
  UnifiedVectorFormat *pUVar10;
  undefined8 *puVar11;
  string_t a;
  string_t sVar12;
  anon_struct_16_3_d7536bce_for_pointer aVar13;
  idx_t in_stack_fffffffffffffec8;
  long *local_108;
  long local_100;
  long local_f8;
  UnifiedVectorFormat bdata;
  long local_b8;
  long local_b0;
  UnifiedVectorFormat adata;
  long local_70;
  long local_68;
  
  pvVar4 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
  pvVar5 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,1);
  pvVar6 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,2);
  pUVar1 = *(UnifiedVectorFormat **)(args + 0x18);
  if (((*pvVar4 == (value_type)0x2) && (*pvVar5 == (value_type)0x2)) && (*pvVar6 == (value_type)0x2)
     ) {
    duckdb::Vector::SetVectorType((VectorType)result);
    if ((((*(byte **)(pvVar4 + 0x28) != (byte *)0x0) && ((**(byte **)(pvVar4 + 0x28) & 1) == 0)) ||
        ((*(byte **)(pvVar5 + 0x28) != (byte *)0x0 && ((**(byte **)(pvVar5 + 0x28) & 1) == 0)))) ||
       ((*(byte **)(pvVar6 + 0x28) != (byte *)0x0 && ((**(byte **)(pvVar6 + 0x28) & 1) == 0)))) {
      duckdb::ConstantVector::SetNull(result,true);
      return;
    }
    paVar3 = *(anon_union_16_2_67f50693_for_value **)(result + 0x20);
    aVar13 = (anon_struct_16_3_d7536bce_for_pointer)
             TernaryLambdaWrapper::
             Operation<duckdb::SetBitOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,int,int,duckdb::string_t>
                       ((anon_class_8_1_6971b95b)result,
                        (string_t)(*(anon_union_16_2_67f50693_for_value **)(pvVar4 + 0x20))->pointer
                        ,**(int **)(pvVar5 + 0x20),**(int **)(pvVar6 + 0x20),in_R9,
                        in_stack_fffffffffffffec8);
    paVar3->pointer = aVar13;
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)result);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&adata);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&bdata);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_108);
    duckdb::Vector::ToUnifiedFormat((ulong)pvVar4,pUVar1);
    duckdb::Vector::ToUnifiedFormat((ulong)pvVar5,pUVar1);
    duckdb::Vector::ToUnifiedFormat((ulong)pvVar6,pUVar1);
    lVar2 = *(long *)(result + 0x20);
    FlatVector::VerifyFlatVector(result);
    if (((local_68 == 0) && (local_b0 == 0)) && (local_f8 == 0)) {
      puVar11 = (undefined8 *)(lVar2 + 8);
      for (pUVar10 = (UnifiedVectorFormat *)0x0; pUVar1 != pUVar10; pUVar10 = pUVar10 + 1) {
        pUVar7 = pUVar10;
        if (*_adata != 0) {
          pUVar7 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_adata + (long)pUVar10 * 4);
        }
        pUVar8 = pUVar10;
        if (*_bdata != 0) {
          pUVar8 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_bdata + (long)pUVar10 * 4);
        }
        pUVar9 = pUVar10;
        if (*local_108 != 0) {
          pUVar9 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_108 + (long)pUVar10 * 4);
        }
        a.value.pointer.ptr = (char *)*(undefined8 *)(local_70 + 8 + (long)pUVar7 * 0x10);
        a.value._0_8_ = *(undefined8 *)(local_70 + (long)pUVar7 * 0x10);
        sVar12 = TernaryLambdaWrapper::
                 Operation<duckdb::SetBitOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,int,int,duckdb::string_t>
                           ((anon_class_8_1_6971b95b)result,a,*(int *)(local_b8 + (long)pUVar8 * 4),
                            *(int *)(local_100 + (long)pUVar9 * 4),in_R9,in_stack_fffffffffffffec8);
        puVar11[-1] = sVar12.value._0_8_;
        *puVar11 = sVar12.value._8_8_;
        puVar11 = puVar11 + 2;
      }
    }
    else {
      puVar11 = (undefined8 *)(lVar2 + 8);
      for (pUVar10 = (UnifiedVectorFormat *)0x0; pUVar1 != pUVar10; pUVar10 = pUVar10 + 1) {
        pUVar7 = pUVar10;
        if (*_adata != 0) {
          pUVar7 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_adata + (long)pUVar10 * 4);
        }
        pUVar8 = pUVar10;
        if (*_bdata != 0) {
          pUVar8 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_bdata + (long)pUVar10 * 4);
        }
        pUVar9 = pUVar10;
        if (*local_108 != 0) {
          pUVar9 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_108 + (long)pUVar10 * 4);
        }
        if (((local_68 == 0) ||
            ((*(ulong *)(local_68 + ((ulong)pUVar7 >> 6) * 8) >> ((ulong)pUVar7 & 0x3f) & 1) != 0))
           && (((local_b0 == 0 ||
                ((*(ulong *)(local_b0 + ((ulong)pUVar8 >> 6) * 8) >> ((ulong)pUVar8 & 0x3f) & 1) !=
                 0)) && ((local_f8 == 0 ||
                         ((*(ulong *)(local_f8 + ((ulong)pUVar9 >> 6) * 8) >> ((ulong)pUVar9 & 0x3f)
                          & 1) != 0)))))) {
          sVar12.value.pointer.ptr = (char *)*(undefined8 *)(local_70 + 8 + (long)pUVar7 * 0x10);
          sVar12.value._0_8_ = *(undefined8 *)(local_70 + (long)pUVar7 * 0x10);
          sVar12 = TernaryLambdaWrapper::
                   Operation<duckdb::SetBitOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,int,int,duckdb::string_t>
                             ((anon_class_8_1_6971b95b)result,sVar12,
                              *(int *)(local_b8 + (long)pUVar8 * 4),
                              *(int *)(local_100 + (long)pUVar9 * 4),in_R9,in_stack_fffffffffffffec8
                             );
          puVar11[-1] = sVar12.value._0_8_;
          *puVar11 = sVar12.value._8_8_;
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),(idx_t)pUVar10);
        }
        puVar11 = puVar11 + 2;
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_108);
    UnifiedVectorFormat::~UnifiedVectorFormat(&bdata);
    UnifiedVectorFormat::~UnifiedVectorFormat(&adata);
  }
  return;
}

Assistant:

static void SetBitOperation(DataChunk &args, ExpressionState &state, Vector &result) {
	TernaryExecutor::Execute<string_t, int32_t, int32_t, string_t>(
	    args.data[0], args.data[1], args.data[2], result, args.size(),
	    [&](string_t input, int32_t n, int32_t new_value) {
		    if (new_value != 0 && new_value != 1) {
			    throw InvalidInputException("The new bit must be 1 or 0");
		    }
		    if (n < 0 || (idx_t)n > Bit::BitLength(input) - 1) {
			    throw OutOfRangeException("bit index %s out of valid range (0..%s)", NumericHelper::ToString(n),
			                              NumericHelper::ToString(Bit::BitLength(input) - 1));
		    }
		    string_t target = StringVector::EmptyString(result, input.GetSize());
		    memcpy(target.GetDataWriteable(), input.GetData(), input.GetSize());
		    Bit::SetBit(target, UnsafeNumericCast<idx_t>(n), UnsafeNumericCast<idx_t>(new_value));
		    return target;
	    });
}